

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilder.cpp
# Opt level: O0

void __thiscall
IRBuilder::BuildArgIn(IRBuilder *this,uint32 offset,RegSlot dstRegSlot,uint16 argument)

{
  Func *this_00;
  bool bVar1;
  uint16 uVar2;
  ArgSlot AVar3;
  StackSym *stackSym;
  SymOpnd *src1Opnd;
  RegOpnd *this_01;
  JITTimeProfileInfo *this_02;
  Instr *instr_00;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_46;
  int local_44;
  ValueType profiledValueType;
  StackSym *pSStack_40;
  int paramSlotIndex;
  StackSym *symSrc;
  RegOpnd *dstOpnd;
  SymOpnd *srcOpnd;
  Instr *instr;
  uint16 argument_local;
  RegSlot dstRegSlot_local;
  uint32 offset_local;
  IRBuilder *this_local;
  
  stackSym = StackSym::NewParamSlotSym(argument + 1,this->m_func);
  this_00 = this->m_func;
  pSStack_40 = stackSym;
  uVar2 = LowererMD::GetFormalParamOffset();
  Func::SetArgOffset(this_00,stackSym,((uint)argument + (uint)uVar2) * 8);
  src1Opnd = IR::SymOpnd::New(&pSStack_40->super_Sym,TyVar,this->m_func);
  this_01 = BuildDstOpnd(this,dstRegSlot,TyVar,false,false);
  bVar1 = Func::IsLoopBody(this->m_func);
  if ((!bVar1) && (bVar1 = Func::HasProfileInfo(this->m_func), bVar1)) {
    AVar3 = StackSym::GetParamSlotNum(pSStack_40);
    local_44 = AVar3 - 2;
    if (-1 < local_44) {
      ValueType::ValueType((ValueType *)&local_46.field_0);
      this_02 = Func::GetReadOnlyProfileInfo(this->m_func);
      local_46.field_0 =
           (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
           JITTimeProfileInfo::GetParameterInfo(this_02,(ArgSlot)local_44);
      IR::Opnd::SetValueType(&this_01->super_Opnd,(ValueType)local_46.field_0);
    }
  }
  instr_00 = IR::Instr::New(ArgIn_A,&this_01->super_Opnd,&src1Opnd->super_Opnd,this->m_func);
  AddInstr(this,instr_00,offset);
  return;
}

Assistant:

void
IRBuilder::BuildArgIn(uint32 offset, Js::RegSlot dstRegSlot, uint16 argument)
{
    IR::Instr *     instr;
    IR::SymOpnd *   srcOpnd;
    IR::RegOpnd *   dstOpnd;
    StackSym *      symSrc = StackSym::NewParamSlotSym(argument + 1, m_func);

    this->m_func->SetArgOffset(symSrc, (argument + LowererMD::GetFormalParamOffset()) * MachPtr);

    srcOpnd = IR::SymOpnd::New(symSrc, TyVar, m_func);
    dstOpnd = this->BuildDstOpnd(dstRegSlot);

    if (!this->m_func->IsLoopBody() && this->m_func->HasProfileInfo())
    {
        // Skip "this" pointer; "this" profile data is captured by ProfiledLdThis.
        // Subtract 1 to skip "this" pointer, subtract 1 again to get the index to index into profileData->parameterInfo.
        int paramSlotIndex = symSrc->GetParamSlotNum() - 2;
        if (paramSlotIndex >= 0)
        {
            ValueType profiledValueType;
            profiledValueType = this->m_func->GetReadOnlyProfileInfo()->GetParameterInfo(static_cast<Js::ArgSlot>(paramSlotIndex));
            dstOpnd->SetValueType(profiledValueType);
        }
    }

    instr = IR::Instr::New(Js::OpCode::ArgIn_A, dstOpnd, srcOpnd, m_func);
    this->AddInstr(instr, offset);
}